

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,char *binDir)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  string *psVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  undefined1 local_170 [8];
  string m;
  string local_148 [32];
  undefined1 local_128 [8];
  string fullPath;
  allocator local_f1;
  value_type local_f0;
  _Base_ptr local_d0;
  undefined1 local_c8;
  char *local_c0;
  char *fileName;
  unsigned_long i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  string local_78;
  Directory local_58;
  Directory dir;
  allocator local_39;
  string local_38 [8];
  string bdir;
  char *binDir_local;
  cmCoreTryCompile *this_local;
  
  if (binDir != (char *)0x0) {
    bdir.field_2._8_8_ = binDir;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,binDir,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    lVar4 = std::__cxx11::string::find((char *)local_38,0xa5365f);
    if (lVar4 == -1) {
      cmSystemTools::Error
                ("TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp:",
                 (char *)bdir.field_2._8_8_,(char *)0x0,(char *)0x0);
      dir.Internal._0_4_ = 1;
    }
    else {
      cmsys::Directory::Directory(&local_58);
      uVar1 = bdir.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_78,(char *)uVar1,
                 (allocator *)
                 ((long)&deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      cmsys::Directory::Load(&local_58,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&deletedFiles._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
      for (fileName = (char *)0x0; pcVar6 = fileName,
          pcVar5 = (char *)cmsys::Directory::GetNumberOfFiles(&local_58), pcVar6 < pcVar5;
          fileName = fileName + 1) {
        local_c0 = cmsys::Directory::GetFile(&local_58,(unsigned_long)fileName);
        iVar3 = strcmp(local_c0,".");
        if ((iVar3 != 0) && (iVar3 = strcmp(local_c0,".."), pcVar6 = local_c0, iVar3 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_f0,pcVar6,&local_f1);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&i,&local_f0);
          fullPath.field_2._8_8_ = pVar8.first._M_node;
          local_c8 = pVar8.second;
          local_d0 = (_Base_ptr)fullPath.field_2._8_8_;
          std::__cxx11::string::~string((string *)&local_f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_f1);
          uVar1 = bdir.field_2._8_8_;
          if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_148,(char *)uVar1,(allocator *)(m.field_2._M_local_buf + 0xf));
            pcVar6 = (char *)std::__cxx11::string::append((char *)local_148);
            psVar7 = (string *)std::__cxx11::string::append(pcVar6);
            std::__cxx11::string::string((string *)local_128,psVar7);
            std::__cxx11::string::~string(local_148);
            std::allocator<char>::~allocator((allocator<char> *)(m.field_2._M_local_buf + 0xf));
            bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_128);
            if (bVar2) {
              pcVar6 = (char *)std::__cxx11::string::c_str();
              CleanupFiles(this,pcVar6);
              cmsys::SystemTools::RemoveADirectory((string *)local_128);
            }
            else {
              bVar2 = cmsys::SystemTools::RemoveFile((string *)local_128);
              if (!bVar2) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_170,"Remove failed on file: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_128);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                cmSystemTools::ReportLastSystemError(pcVar6);
                std::__cxx11::string::~string((string *)local_170);
              }
            }
            std::__cxx11::string::~string((string *)local_128);
          }
        }
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i);
      cmsys::Directory::~Directory(&local_58);
      dir.Internal._0_4_ = 0;
    }
    std::__cxx11::string::~string(local_38);
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(const char* binDir)
{
  if (!binDir) {
    return;
  }

  std::string bdir = binDir;
  if (bdir.find("CMakeTmp") == std::string::npos) {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp:",
      binDir);
    return;
  }

  cmsys::Directory dir;
  dir.Load(binDir);
  std::set<std::string> deletedFiles;
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0) {
      if (deletedFiles.insert(fileName).second) {
        std::string const fullPath =
          std::string(binDir).append("/").append(fileName);
        if (cmSystemTools::FileIsDirectory(fullPath)) {
          this->CleanupFiles(fullPath.c_str());
          cmSystemTools::RemoveADirectory(fullPath);
        } else {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          while (!cmSystemTools::RemoveFile(fullPath.c_str()) &&
                 --retry.Count &&
                 cmSystemTools::FileExists(fullPath.c_str())) {
            cmSystemTools::Delay(retry.Delay);
          }
          if (retry.Count == 0)
#else
          if (!cmSystemTools::RemoveFile(fullPath))
#endif
          {
            std::string m = "Remove failed on file: " + fullPath;
            cmSystemTools::ReportLastSystemError(m.c_str());
          }
        }
      }
    }
  }
}